

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O1

CTransactionRef __thiscall TxOrphanage::GetTxToReconsider(TxOrphanage *this,NodeId peer)

{
  long lVar1;
  const_iterator __position;
  _Base_ptr p_Var2;
  undefined4 uVar3;
  iterator iVar4;
  long lVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar6;
  long in_FS_OFFSET;
  CTransactionRef CVar7;
  Wtxid wtxid;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = peer + 0x38;
  lVar5 = lVar1;
  for (lVar6 = *(long *)(peer + 0x40); lVar6 != 0;
      lVar6 = *(long *)(lVar6 + 0x10 + (ulong)(*(long *)(lVar6 + 0x20) < (long)in_RDX._M_pi) * 8)) {
    if ((long)in_RDX._M_pi <= *(long *)(lVar6 + 0x20)) {
      lVar5 = lVar6;
    }
  }
  lVar6 = lVar1;
  if ((lVar5 != lVar1) && (lVar6 = lVar5, (long)in_RDX._M_pi < *(long *)(lVar5 + 0x20))) {
    lVar6 = lVar1;
  }
  if ((lVar6 != lVar1) && (*(long *)(lVar6 + 0x50) != 0)) {
    do {
      __position._M_node = *(_Base_ptr *)(lVar6 + 0x40);
      local_58._0_8_ = *(undefined8 *)(__position._M_node + 1);
      local_58._8_8_ = __position._M_node[1]._M_parent;
      local_48 = __position._M_node[1]._M_left;
      p_Stack_40 = __position._M_node[1]._M_right;
      std::
      _Rb_tree<transaction_identifier<true>,transaction_identifier<true>,std::_Identity<transaction_identifier<true>>,std::less<transaction_identifier<true>>,std::allocator<transaction_identifier<true>>>
      ::erase_abi_cxx11_((_Rb_tree<transaction_identifier<true>,transaction_identifier<true>,std::_Identity<transaction_identifier<true>>,std::less<transaction_identifier<true>>,std::allocator<transaction_identifier<true>>>
                          *)(lVar6 + 0x28),__position);
      iVar4 = std::
              _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
              ::find((_Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                      *)peer,(key_type *)local_58);
      in_RDX._M_pi = extraout_RDX;
      if (iVar4._M_node != (_Base_ptr)(peer + 8)) {
        uVar3 = *(undefined4 *)&iVar4._M_node[2].field_0x4;
        *(_Rb_tree_color *)&(this->m_orphans)._M_t._M_impl.field_0x0 = iVar4._M_node[2]._M_color;
        *(undefined4 *)&(this->m_orphans)._M_t._M_impl.field_0x4 = uVar3;
        p_Var2 = iVar4._M_node[2]._M_parent;
        *(_Base_ptr *)&(this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var2;
        if (p_Var2 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
          }
        }
        goto LAB_00af2c19;
      }
    } while (*(long *)(lVar6 + 0x50) != 0);
  }
  *(undefined8 *)&(this->m_orphans)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
LAB_00af2c19:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    CVar7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         in_RDX._M_pi;
    CVar7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)CVar7.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

CTransactionRef TxOrphanage::GetTxToReconsider(NodeId peer)
{
    auto work_set_it = m_peer_work_set.find(peer);
    if (work_set_it != m_peer_work_set.end()) {
        auto& work_set = work_set_it->second;
        while (!work_set.empty()) {
            Wtxid wtxid = *work_set.begin();
            work_set.erase(work_set.begin());

            const auto orphan_it = m_orphans.find(wtxid);
            if (orphan_it != m_orphans.end()) {
                return orphan_it->second.tx;
            }
        }
    }
    return nullptr;
}